

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationLayer.cpp
# Opt level: O1

void __thiscall SerializationLayer::handlePacket(SerializationLayer *this,Buffer *packet)

{
  Buffer local_28;
  
  std::vector<char,_std::allocator<char>_>::vector(&local_28.data,&packet->data);
  SynchronizedQueue<Buffer>::put(&this->packetQueue,&local_28);
  if (local_28.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SerializationLayer::handlePacket(Buffer packet) {
    packetQueue.put(packet);
}